

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autolink.cc
# Opt level: O2

void predict_or_learn<true>(autolink *b,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  features *this;
  size_t i;
  ulong uVar2;
  float local_2c;
  
  LEARNER::learner<char,_example>::predict(base,ec,0);
  local_2c = (ec->pred).scalar;
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&autolink_namespace);
  this = (ec->super_example_predict).feature_space + 0x82;
  for (uVar2 = 0; uVar2 < b->d; uVar2 = uVar2 + 1) {
    if ((local_2c != 0.0) || (NAN(local_2c))) {
      features::push_back(this,local_2c,(uVar2 << ((byte)b->stride_shift & 0x3f)) + 0x1f3fae4b);
      local_2c = local_2c * (ec->pred).scalar;
    }
  }
  ec->total_sum_feat_sq =
       (ec->super_example_predict).feature_space[0x82].sum_feat_sq + ec->total_sum_feat_sq;
  LEARNER::learner<char,_example>::learn(base,ec,0);
  ec->total_sum_feat_sq =
       ec->total_sum_feat_sq - (ec->super_example_predict).feature_space[0x82].sum_feat_sq;
  features::clear(this);
  ppuVar1 = &(ec->super_example_predict).indices._end;
  *ppuVar1 = *ppuVar1 + -1;
  return;
}

Assistant:

void predict_or_learn(autolink& b, LEARNER::single_learner& base, example& ec)
{
  base.predict(ec);
  float base_pred = ec.pred.scalar;
  // add features of label
  ec.indices.push_back(autolink_namespace);
  features& fs = ec.feature_space[autolink_namespace];
  for (size_t i = 0; i < b.d; i++)
    if (base_pred != 0.)
    {
      fs.push_back(base_pred, autoconstant + (i << b.stride_shift));
      base_pred *= ec.pred.scalar;
    }
  ec.total_sum_feat_sq += fs.sum_feat_sq;

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  ec.total_sum_feat_sq -= fs.sum_feat_sq;
  fs.clear();
  ec.indices.pop();
}